

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O3

long __thiscall PrimeExtractor::findNextStep(PrimeExtractor *this)

{
  _Bit_type *p_Var1;
  long lVar2;
  ulong uVar3;
  ulong uVar5;
  ulong uVar4;
  
  p_Var1 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  lVar2 = this->lastStep * 2 + 1;
  uVar4 = this->lastStep;
  do {
    uVar3 = uVar4 + 1;
    if ((ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) * 8
        <= uVar3) {
      return 0;
    }
    uVar5 = uVar4 + 0x40;
    if (-1 < (long)uVar3) {
      uVar5 = uVar3;
    }
    lVar2 = lVar2 + 2;
    uVar4 = uVar3;
  } while ((p_Var1[((long)uVar5 >> 6) +
                   (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
            >> (uVar3 & 0x3f) & 1) == 0);
  this->lastStep = uVar3;
  return lVar2;
}

Assistant:

long PrimeExtractor::findNextStep()
{
  for (long i = this->lastStep +1; i < this->primeCand.size(); i++) {
    if (this->primeCand[i] == true) {
      this->lastStep = i;
      return i*2+1 ;
    } 
  }
  return 0;
}